

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fImplementationLimitTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::CompressedTextureFormatsQueryCase::iterate
          (CompressedTextureFormatsQueryCase *this)

{
  ostringstream *poVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  bool bVar4;
  int iVar5;
  deUint32 err;
  undefined4 extraout_var;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  char *description;
  long lVar8;
  size_type __n;
  _Rb_tree_color *p_Var9;
  vector<int,_std::allocator<int>_> formats;
  set<int,_std::less<int>,_std::allocator<int>_> formatSet;
  GLint val;
  vector<int,_std::allocator<int>_> local_208;
  Enum<int,_2UL> local_1f0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1e0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  local_1b0._0_4_ = 0xffffffff;
  (**(code **)(lVar8 + 0x868))(0x86a2,local_1b0);
  __n = (size_type)(int)local_1b0._0_4_;
  std::vector<int,_std::allocator<int>_>::vector(&local_208,__n,(allocator_type *)local_1b0);
  if (0 < (long)__n) {
    (**(code **)(lVar8 + 0x868))
              (0x86a3,local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  err = (**(code **)(lVar8 + 0x800))();
  glu::checkError(err,"Query failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fImplementationLimitTests.cpp"
                  ,0x128);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Reported:",9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    p_Var9 = (_Rb_tree_color *)
             local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    do {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      local_1e0._M_impl.super__Rb_tree_header._M_header._M_color = *p_Var9;
      local_1e0._M_impl._0_8_ = glu::getCompressedTextureFormatName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1e0,(ostream *)poVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      p_Var9 = p_Var9 + 1;
    } while (p_Var9 != (_Rb_tree_color *)
                       local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::set<int,std::less<int>,std::allocator<int>>::
  set<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((set<int,std::less<int>,std::allocator<int>> *)&local_1e0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  p_Var2 = &local_1e0._M_impl.super__Rb_tree_header;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  bVar4 = true;
  lVar8 = 0;
  do {
    iVar5 = (&s_requiredCompressedTexFormats)[lVar8];
    p_Var6 = &p_Var2->_M_header;
    for (p_Var3 = local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent;
        (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
        p_Var3 = (&p_Var3->_M_left)[(int)*(size_t *)(p_Var3 + 1) < iVar5]) {
      if (iVar5 <= (int)*(size_t *)(p_Var3 + 1)) {
        p_Var6 = p_Var3;
      }
    }
    p_Var7 = p_Var2;
    if (((_Rb_tree_header *)p_Var6 != p_Var2) &&
       (p_Var7 = (_Rb_tree_header *)p_Var6, iVar5 < (int)((_Rb_tree_header *)p_Var6)->_M_node_count)
       ) {
      p_Var7 = p_Var2;
    }
    if (p_Var7 == p_Var2) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ERROR: ",7);
      local_1f0.m_getName = glu::getCompressedTextureFormatName;
      local_1f0.m_value = iVar5;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," is missing!",0xc);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      bVar4 = false;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 10);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1e0);
  description = "Requirement not satisfied";
  if (bVar4) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~bVar4 & QP_TEST_RESULT_FAIL,description);
  if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
		const GLint				numFormats		= query<GLint>(gl, GL_NUM_COMPRESSED_TEXTURE_FORMATS);
		vector<GLint>			formats			(numFormats);
		bool					allFormatsOk	= true;

		if (numFormats > 0)
			gl.getIntegerv(GL_COMPRESSED_TEXTURE_FORMATS, &formats[0]);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Query failed");

		// Log formats.
		m_testCtx.getLog() << TestLog::Message << "Reported:" << TestLog::EndMessage;
		for (vector<GLint>::const_iterator fmt = formats.begin(); fmt != formats.end(); fmt++)
			m_testCtx.getLog() << TestLog::Message << glu::getCompressedTextureFormatStr(*fmt) << TestLog::EndMessage;

		// Check that all required formats are in list.
		{
			set<GLint> formatSet(formats.begin(), formats.end());

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_requiredCompressedTexFormats); ndx++)
			{
				const deUint32	fmt		= s_requiredCompressedTexFormats[ndx];
				const bool		found	= formatSet.find(fmt) != formatSet.end();

				if (!found)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: " << glu::getCompressedTextureFormatStr(fmt) << " is missing!" << TestLog::EndMessage;
					allFormatsOk = false;
				}
			}
		}

		m_testCtx.setTestResult(allFormatsOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								allFormatsOk ? "Pass"				: "Requirement not satisfied");
		return STOP;
	}